

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts3UpdateDocTotals(int *pRC,Fts3Table *p,u32 *aSzIns,u32 *aSzDel,int nChng)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  int iVar3;
  u32 *a;
  void *pvVar4;
  u32 uVar5;
  long lVar6;
  u32 uVar7;
  long lVar8;
  int j;
  int iVar9;
  long in_FS_OFFSET;
  sqlite3_stmt *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*pRC == 0) {
    lVar6 = (long)p->nColumn + 2;
    a = (u32 *)sqlite3_malloc64(lVar6 * 0xe);
    if (a == (u32 *)0x0) {
      *pRC = 7;
    }
    else {
      local_48 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
      iVar2 = fts3SqlStmt(p,0x16,&local_48,(sqlite3_value **)0x0);
      psVar1 = local_48;
      if (iVar2 == 0) {
        sqlite3_bind_int64(local_48,1,0);
        iVar2 = sqlite3_step(psVar1);
        if (iVar2 == 100) {
          lVar8 = 0;
          pvVar4 = sqlite3_column_blob(psVar1,0);
          iVar2 = sqlite3_column_bytes(psVar1,0);
          if (iVar2 != 0) {
            iVar9 = 0;
            if (*(char *)((long)pvVar4 + (long)iVar2 + -1) < '\0') {
              lVar8 = 0;
            }
            else {
              lVar8 = 0;
              for (; (lVar8 < lVar6 && (iVar9 < iVar2)); iVar9 = iVar9 + iVar3) {
                local_40 = &DAT_aaaaaaaaaaaaaaaa;
                iVar3 = sqlite3Fts3GetVarintU
                                  ((char *)((long)iVar9 + (long)pvVar4),(sqlite_uint64 *)&local_40);
                a[lVar8] = (u32)local_40;
                lVar8 = lVar8 + 1;
              }
            }
          }
          for (; lVar8 < lVar6; lVar8 = lVar8 + 1) {
            a[lVar8] = 0;
          }
        }
        else {
          memset(a,0,lVar6 * 4);
        }
        iVar2 = sqlite3_reset(psVar1);
        if (iVar2 == 0) {
          uVar7 = *a + nChng;
          uVar5 = uVar7;
          if (*a < (uint)-nChng) {
            uVar5 = 0;
          }
          if (-1 < nChng) {
            uVar5 = uVar7;
          }
          *a = uVar5;
          for (lVar8 = 0; lVar8 <= p->nColumn; lVar8 = lVar8 + 1) {
            uVar5 = (aSzIns[lVar8] + a[lVar8 + 1]) - aSzDel[lVar8];
            if (aSzIns[lVar8] + a[lVar8 + 1] < aSzDel[lVar8]) {
              uVar5 = 0;
            }
            a[lVar8 + 1] = uVar5;
          }
          local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
          fts3EncodeIntArray((int)lVar6,a,(char *)(a + lVar6),(int *)&local_40);
          iVar2 = fts3SqlStmt(p,0x17,&local_48,(sqlite3_value **)0x0);
          psVar1 = local_48;
          if (iVar2 == 0) {
            sqlite3_bind_int64(local_48,1,0);
            sqlite3_bind_blob(psVar1,2,a + lVar6,(u32)local_40,(_func_void_void_ptr *)0x0);
            sqlite3_step(psVar1);
            iVar2 = sqlite3_reset(psVar1);
            *pRC = iVar2;
            sqlite3_bind_null(psVar1,2);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              sqlite3_free(a);
              return;
            }
            goto LAB_001b56a7;
          }
        }
      }
      sqlite3_free(a);
      *pRC = iVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001b56a7:
  __stack_chk_fail();
}

Assistant:

static void fts3UpdateDocTotals(
  int *pRC,                       /* The result code */
  Fts3Table *p,                   /* Table being updated */
  u32 *aSzIns,                    /* Size increases */
  u32 *aSzDel,                    /* Size decreases */
  int nChng                       /* Change in the number of documents */
){
  char *pBlob;             /* Storage for BLOB written into %_stat */
  int nBlob;               /* Size of BLOB written into %_stat */
  u32 *a;                  /* Array of integers that becomes the BLOB */
  sqlite3_stmt *pStmt;     /* Statement for reading and writing */
  int i;                   /* Loop counter */
  int rc;                  /* Result code from subfunctions */

  const int nStat = p->nColumn+2;

  if( *pRC ) return;
  a = sqlite3_malloc64( (sizeof(u32)+10)*(sqlite3_int64)nStat );
  if( a==0 ){
    *pRC = SQLITE_NOMEM;
    return;
  }
  pBlob = (char*)&a[nStat];
  rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  if( sqlite3_step(pStmt)==SQLITE_ROW ){
    fts3DecodeIntArray(nStat, a,
         sqlite3_column_blob(pStmt, 0),
         sqlite3_column_bytes(pStmt, 0));
  }else{
    memset(a, 0, sizeof(u32)*(nStat) );
  }
  rc = sqlite3_reset(pStmt);
  if( rc!=SQLITE_OK ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  if( nChng<0 && a[0]<(u32)(-nChng) ){
    a[0] = 0;
  }else{
    a[0] += nChng;
  }
  for(i=0; i<p->nColumn+1; i++){
    u32 x = a[i+1];
    if( x+aSzIns[i] < aSzDel[i] ){
      x = 0;
    }else{
      x = x + aSzIns[i] - aSzDel[i];
    }
    a[i+1] = x;
  }
  fts3EncodeIntArray(nStat, a, pBlob, &nBlob);
  rc = fts3SqlStmt(p, SQL_REPLACE_STAT, &pStmt, 0);
  if( rc ){
    sqlite3_free(a);
    *pRC = rc;
    return;
  }
  sqlite3_bind_int(pStmt, 1, FTS_STAT_DOCTOTAL);
  sqlite3_bind_blob(pStmt, 2, pBlob, nBlob, SQLITE_STATIC);
  sqlite3_step(pStmt);
  *pRC = sqlite3_reset(pStmt);
  sqlite3_bind_null(pStmt, 2);
  sqlite3_free(a);
}